

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnElemSegmentElemExpr_RefNull
          (BinaryReaderObjdump *this,Index segment_index,Type type)

{
  uint uVar1;
  uint64_t uVar2;
  Type local_40;
  string local_38;
  
  uVar1 = this->elem_index_;
  uVar2 = this->elem_offset_;
  local_40 = type;
  Type::GetName_abi_cxx11_(&local_38,&local_40);
  PrintDetails(this,"  - elem[%lu] = ref.null %s\n",uVar1 + uVar2,local_38._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  this->elem_index_ = this->elem_index_ + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                          Type type) {
  PrintDetails("  - elem[%" PRIu64 "] = ref.null %s\n",
               elem_offset_ + elem_index_, type.GetName().c_str());
  elem_index_++;
  return Result::Ok;
}